

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractPlugin.cpp
# Opt level: O0

void __thiscall
Corrade::PluginManager::AbstractPlugin::AbstractPlugin
          (AbstractPlugin *this,AbstractManager *manager,StringView *plugin)

{
  StringView plugin_00;
  StringView *pSVar1;
  State *pSVar2;
  ConfigurationGroup *pCVar3;
  String local_50 [48];
  StringView *local_20;
  StringView *plugin_local;
  AbstractManager *manager_local;
  AbstractPlugin *this_local;
  
  this->_vptr_AbstractPlugin = (_func_int **)&PTR___cxa_pure_virtual_00127d90;
  local_20 = plugin;
  plugin_local = (StringView *)manager;
  manager_local = (AbstractManager *)this;
  Containers::Pointer<Corrade::PluginManager::AbstractPlugin::State>::Pointer<>();
  pSVar1 = plugin_local;
  pSVar2 = Containers::Pointer<Corrade::PluginManager::AbstractPlugin::State>::operator->
                     (&this->_state);
  pSVar2->manager = (AbstractManager *)pSVar1;
  Corrade::Containers::String::nullTerminatedGlobalView
            (local_50,local_20->_data,local_20->_sizePlusFlags);
  pSVar2 = Containers::Pointer<Corrade::PluginManager::AbstractPlugin::State>::operator->
                     (&this->_state);
  Corrade::Containers::String::operator=(&pSVar2->plugin,local_50);
  Corrade::Containers::String::~String(local_50);
  pSVar1 = plugin_local;
  plugin_00 = *local_20;
  pSVar2 = Containers::Pointer<Corrade::PluginManager::AbstractPlugin::State>::operator->
                     (&this->_state);
  AbstractManager::registerInstance((AbstractManager *)pSVar1,plugin_00,this,&pSVar2->metadata);
  pSVar2 = Containers::Pointer<Corrade::PluginManager::AbstractPlugin::State>::operator->
                     (&this->_state);
  pCVar3 = PluginMetadata::configuration(pSVar2->metadata);
  pSVar2 = Containers::Pointer<Corrade::PluginManager::AbstractPlugin::State>::operator->
                     (&this->_state);
  Corrade::Utility::ConfigurationGroup::operator=(&pSVar2->configuration,pCVar3);
  return;
}

Assistant:

AbstractPlugin::AbstractPlugin(AbstractManager& manager, const Containers::StringView& plugin): _state{InPlaceInit} {
    _state->manager = &manager;
    _state->plugin = Containers::String::nullTerminatedGlobalView(plugin);
    manager.registerInstance(plugin, *this, _state->metadata);
    _state->configuration = _state->metadata->configuration();
}